

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void store_pool_error(png_store *ps,png_const_structp pp,char *msg)

{
  char *msg_local;
  png_const_structp pp_local;
  png_store *ps_local;
  
  if (pp != (png_const_structp)0x0) {
    png_error(pp,msg);
  }
  store_log(ps,pp,msg,1);
  return;
}

Assistant:

static void
store_pool_error(png_store *ps, png_const_structp pp, const char *msg)
{
   if (pp != NULL)
      png_error(pp, msg);

   /* Else we have to do it ourselves.  png_error eventually calls store_log,
    * above.  store_log accepts a NULL png_structp - it just changes what gets
    * output by store_message.
    */
   store_log(ps, pp, msg, 1 /* error */);
}